

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_flbi.c
# Opt level: O1

char * cmime_flbi_scan_postface(char *s,CMimeMessage_T *msg)

{
  size_t sVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  _BoundaryInfo_T *__ptr;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  _BoundaryInfo_T *__ptr_00;
  CMimeListElem_T *pCVar9;
  char *pcVar10;
  bool bVar11;
  int local_58;
  char *local_50;
  
  pcVar5 = strstr(s,"--");
  iVar4 = 0;
  if (pcVar5 == (char *)0x0) {
    local_50 = (char *)0x0;
  }
  else {
    local_50 = (char *)0x0;
    do {
      __ptr = _cmime_internal_get_boundary_info(msg->boundaries,pcVar5,msg->linebreak);
      if (__ptr != (_BoundaryInfo_T *)0x0) {
        if (__ptr->type == CMIME_BOUNDARY_CLOSE) {
          if (iVar4 == 0) {
            sVar6 = strlen(s);
            sVar7 = strlen(pcVar5);
            sVar6 = (size_t)((int)sVar6 - (int)sVar7);
            local_50 = (char *)calloc(sVar6 + 1,1);
            strncpy(local_50,s,sVar6);
            sVar6 = strlen(local_50);
            local_50[sVar6] = '\0';
            iVar4 = 1;
          }
          pcVar10 = pcVar5 + __ptr->len;
          pcVar8 = strstr(pcVar10,"--");
          if (pcVar8 == (char *)0x0) {
            sVar6 = strlen(s);
            sVar7 = strlen(pcVar10);
            local_58 = (int)sVar6 - (int)sVar7;
            pcVar5 = pcVar10;
          }
          else {
            __ptr_00 = _cmime_internal_get_boundary_info(msg->boundaries,pcVar8,msg->linebreak);
            if (__ptr_00 == (_BoundaryInfo_T *)0x0) {
              sVar6 = strlen(s);
              sVar7 = strlen(pcVar5);
              local_58 = (int)sVar6 - (int)sVar7;
            }
            else {
              sVar1 = __ptr_00->len;
              sVar6 = strlen(pcVar5 + sVar1);
              sVar7 = strlen(pcVar8);
              local_58 = (int)sVar6 - (int)sVar7;
              free(__ptr_00->marker);
              free(__ptr_00);
              pcVar5 = pcVar5 + sVar1;
            }
          }
          pCVar9 = msg->parts->tail;
          if (pCVar9 != (CMimeListElem_T *)0x0) {
            pcVar8 = __ptr->marker;
            do {
              pvVar2 = pCVar9->data;
              pcVar10 = *(char **)((long)pvVar2 + 0x18);
              if (pcVar10 == (char *)0x0) {
                bVar11 = false;
              }
              else {
                sVar6 = strlen(pcVar10);
                iVar3 = strncmp(pcVar10,pcVar8 + 2,sVar6);
                bVar11 = iVar3 == 0;
              }
              pcVar10 = *(char **)((long)pvVar2 + 0x10);
              if (pcVar10 != (char *)0x0) {
                sVar6 = strlen(pcVar10);
                iVar3 = strncmp(pcVar10,pcVar8 + 2,sVar6);
                if (iVar3 == 0) {
                  bVar11 = true;
                }
              }
              if (bVar11) {
                if (*(void **)((long)pvVar2 + 0x20) != (void *)0x0) {
                  free(*(void **)((long)pvVar2 + 0x20));
                }
                pcVar8 = (char *)calloc((long)local_58 + 1,1);
                strncpy(pcVar8,pcVar5,(long)local_58);
                sVar6 = strlen(pcVar8);
                pcVar8[sVar6] = '\0';
                *(char **)((long)pvVar2 + 0x20) = pcVar8;
                *(undefined2 *)((long)pvVar2 + 0x28) = 1;
                break;
              }
              pCVar9 = pCVar9->prev;
            } while (pCVar9 != (_CMimeListElem *)0x0);
          }
        }
        iVar4 = iVar4 + 1;
        free(__ptr->marker);
        free(__ptr);
      }
      pcVar5 = strstr(pcVar5 + 1,"--");
    } while (pcVar5 != (char *)0x0);
  }
  if (local_50 == (char *)0x0) {
    pcVar5 = strdup(s);
    return pcVar5;
  }
  return local_50;
}

Assistant:

char *cmime_flbi_scan_postface(char *s, CMimeMessage_T *msg) {
    char *it = s;
    _BoundaryInfo_T *info = NULL;
    char *boundary;
    char *postface = NULL;
    char *nxt = NULL;
    _BoundaryInfo_T *nxt_info = NULL;
    char *t = NULL;
    int count;
    int offset = 0;
    CMimeListElem_T *elem = NULL;
    CMimePart_T *part = NULL;
    int match = 0;

    count = 0;
    while((it = strstr(it,"--"))!=NULL) {
        info = _cmime_internal_get_boundary_info(msg->boundaries,it,msg->linebreak);
        if (info!=NULL) {
            //len = strlen(marker);
            //if ((marker[len-2]=='-')&&(marker[len-1]=='-')) {
            if (info->type == CMIME_BOUNDARY_CLOSE) {
                if (count == 0) {
                    offset = strlen(s) - strlen(it);
                    postface = (char *)calloc(offset + sizeof(char),sizeof(char));
                    strncpy(postface,s,offset);
                    postface[strlen(postface)] = '\0';
                    count++;
                } 
                nxt = it + info->len;
                if ((nxt = strstr(nxt,"--"))!=NULL) { 
                    if ((nxt_info = _cmime_internal_get_boundary_info(msg->boundaries,nxt,msg->linebreak))!=NULL) {  
                        it = it + nxt_info->len;
                        offset = strlen(it) - strlen(nxt); 
                        free(nxt_info->marker);
                        free(nxt_info);
                        nxt_info = NULL;
                    } else
                        offset = strlen(s) - strlen(it);
                } else {
                    it = it + info->len;
                    offset = strlen(s) - strlen(it);
                }

                /* jump over 2 starting - chars for boundary comparsion */
                boundary = info->marker;
                boundary += 2 * sizeof(char);
                /* find mime part which belongs to this boundary */
                elem = cmime_list_tail(msg->parts);
                while(elem!=NULL) {
                    part = (CMimePart_T *)cmime_list_data(elem);
                    match = 0;
                    if (part->parent_boundary!=NULL) {
                        if (strncmp(part->parent_boundary,boundary,strlen(part->parent_boundary))==0) 
                            match = 1;
                    }

                    if (part->boundary!=NULL) {
                        if (strncmp(part->boundary,boundary,strlen(part->boundary))==0) 
                            match = 1;
                    }
                    
                    if (match == 1) {
                        if (part->postface!=NULL)
                            free(part->postface);

                        t = (char *)calloc(offset + sizeof(char),sizeof(char));
                        strncpy(t,it,offset);
                        t[strlen(t)] = '\0';
                        part->postface = t;
                        part->last = 1;
                        break;
                   } 
                    
                    elem = elem->prev;
                }
            }
            count++;
            free(info->marker);
            free(info);
            info = NULL;
        }
        
        it++;
    }
    
    if (postface==NULL)
        postface = strdup(s);
    return(postface);
}